

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigInt.cpp
# Opt level: O0

void __thiscall BigInt::operator=(BigInt *this,BigInt *b)

{
  bool positive_sign;
  string local_90 [48];
  string local_60 [32];
  undefined1 local_40 [8];
  string value;
  bool positive;
  BigInt *b_local;
  BigInt *this_local;
  
  positive_sign = b->sign == 0;
  to_string_abi_cxx11_((BigInt *)local_40);
  if (!positive_sign) {
    std::__cxx11::string::substr((ulong)local_60,(ulong)local_40);
    std::__cxx11::string::operator=((string *)local_40,local_60);
    std::__cxx11::string::~string(local_60);
  }
  std::__cxx11::string::string(local_90,(string *)local_40);
  set_number(this,(string *)local_90,positive_sign);
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void BigInt::operator=(BigInt b) {
    bool positive = b.sign == 0 ? true : false;
    string value = b.to_string();
    if (positive == false) {
        value = value.substr(1);
    }
    this->set_number(value, positive);
}